

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

size_t multissl_version(char *buffer,size_t size)

{
  Curl_ssl *pCVar1;
  int iVar2;
  Curl_ssl *pCVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  Curl_ssl **ppCVar7;
  char *pcVar8;
  char *buffer_00;
  char vb [200];
  char local_f8 [200];
  
  pCVar3 = Curl_ssl;
  if (Curl_ssl == &Curl_ssl_multi) {
    pCVar3 = available_backends[0];
  }
  if (pCVar3 != multissl_version::selected) {
    multissl_version::backends[0] = '\0';
    buffer_00 = multissl_version::backends;
    multissl_version::selected = pCVar3;
    if (available_backends[0] != (Curl_ssl *)0x0) {
      buffer_00 = multissl_version::backends;
      ppCVar7 = available_backends;
      pCVar3 = available_backends[0];
      do {
        pCVar1 = multissl_version::selected;
        ppCVar7 = ppCVar7 + 1;
        sVar4 = (*pCVar3->version)(local_f8,200);
        if (sVar4 != 0) {
          pcVar6 = " ";
          if (-(long)buffer_00 == -0x19a3e0) {
            pcVar6 = "";
          }
          pcVar8 = "(";
          if (pCVar1 == pCVar3) {
            pcVar8 = "";
          }
          pcVar5 = ")";
          if (pCVar1 == pCVar3) {
            pcVar5 = "";
          }
          iVar2 = curl_msnprintf(buffer_00,(long)&multissl_version::backends_len + -(long)buffer_00,
                                 "%s%s%s%s",pcVar6,pcVar8,local_f8,pcVar5);
          buffer_00 = buffer_00 + iVar2;
        }
        pCVar3 = *ppCVar7;
      } while (pCVar3 != (Curl_ssl *)0x0);
    }
    multissl_version::backends_len = (size_t)(buffer_00 + -0x19a3e0);
  }
  if (size != 0) {
    if (multissl_version::backends_len < size) {
      strcpy(buffer,multissl_version::backends);
    }
    else {
      *buffer = '\0';
    }
  }
  return 0;
}

Assistant:

static size_t multissl_version(char *buffer, size_t size)
{
  static const struct Curl_ssl *selected;
  static char backends[200];
  static size_t backends_len;
  const struct Curl_ssl *current;

  current = Curl_ssl == &Curl_ssl_multi ? available_backends[0] : Curl_ssl;

  if(current != selected) {
    char *p = backends;
    char *end = backends + sizeof(backends);
    int i;

    selected = current;

    backends[0] = '\0';

    for(i = 0; available_backends[i]; ++i) {
      char vb[200];
      bool paren = (selected != available_backends[i]);

      if(available_backends[i]->version(vb, sizeof(vb))) {
        p += msnprintf(p, end - p, "%s%s%s%s", (p != backends ? " " : ""),
                       (paren ? "(" : ""), vb, (paren ? ")" : ""));
      }
    }

    backends_len = p - backends;
  }

  if(size) {
    if(backends_len < size)
      strcpy(buffer, backends);
    else
      *buffer = 0; /* did not fit */
  }
  return 0;
}